

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseOptionNamePart
          (Parser *this,UninterpretedOption *uninterpreted_option,LocationRecorder *part_location,
          FileDescriptorProto *containing_file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  string *psVar5;
  Arena *pAVar6;
  string_view text;
  string_view text_00;
  string_view text_01;
  string identifier;
  LocationRecorder location;
  string local_68;
  LocationRecorder local_48;
  
  pvVar4 = internal::RepeatedPtrFieldBase::AddMessageLite
                     (&(uninterpreted_option->field_0)._impl_.name_.super_RepeatedPtrFieldBase,
                      Arena::DefaultConstruct<google::protobuf::UninterpretedOption_NamePart>);
  paVar1 = &local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_68._M_dataplus._M_p = (pointer)paVar1;
  if ((this->input_->current_).text._M_string_length == 1) {
    iVar3 = bcmp((this->input_->current_).text._M_dataplus._M_p,"(",1);
    if (iVar3 != 0) goto LAB_001ff061;
    text._M_str = "(";
    text._M_len = 1;
    bVar2 = Consume(this,text);
    if (bVar2) {
      LocationRecorder::Init(&local_48,part_location,part_location->source_code_info_);
      RepeatedField<int>::Add(&((local_48.location_)->field_0)._impl_.path_,1);
      if ((this->input_->current_).type != TYPE_IDENTIFIER) {
LAB_001ff188:
        while( true ) {
          if ((this->input_->current_).text._M_string_length != 1) break;
          iVar3 = bcmp((this->input_->current_).text._M_dataplus._M_p,".",1);
          if (iVar3 != 0) break;
          text_00._M_str = ".";
          text_00._M_len = 1;
          bVar2 = Consume(this,text_00);
          if (!bVar2) goto LAB_001ff248;
          *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
          pAVar6 = *(Arena **)((long)pvVar4 + 8);
          if (((ulong)pAVar6 & 1) != 0) {
            pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
          }
          psVar5 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                             ((ArenaStringPtr *)((long)pvVar4 + 0x18),pAVar6);
          std::__cxx11::string::append((char *)psVar5);
          bVar2 = ConsumeIdentifier(this,&local_68,(ErrorMaker)ZEXT816(0x3e90c3));
          if (!bVar2) goto LAB_001ff248;
          *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
          pAVar6 = *(Arena **)((long)pvVar4 + 8);
          if (((ulong)pAVar6 & 1) != 0) {
            pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
          }
          psVar5 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                             ((ArenaStringPtr *)((long)pvVar4 + 0x18),pAVar6);
          std::__cxx11::string::_M_append((char *)psVar5,(ulong)local_68._M_dataplus._M_p);
        }
        LocationRecorder::~LocationRecorder(&local_48);
        text_01._M_str = ")";
        text_01._M_len = 1;
        bVar2 = Consume(this,text_01);
        if (!bVar2) goto LAB_001ff252;
        *(undefined1 *)((long)pvVar4 + 0x20) = 1;
        *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 2;
        goto LAB_001ff0f0;
      }
      bVar2 = ConsumeIdentifier(this,&local_68,(ErrorMaker)ZEXT816(0x3e90c3));
      if (bVar2) {
        *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
        pAVar6 = *(Arena **)((long)pvVar4 + 8);
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        psVar5 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                           ((ArenaStringPtr *)((long)pvVar4 + 0x18),pAVar6);
        std::__cxx11::string::_M_append((char *)psVar5,(ulong)local_68._M_dataplus._M_p);
        goto LAB_001ff188;
      }
      goto LAB_001ff248;
    }
  }
  else {
LAB_001ff061:
    LocationRecorder::Init(&local_48,part_location,part_location->source_code_info_);
    RepeatedField<int>::Add(&((local_48.location_)->field_0)._impl_.path_,1);
    bVar2 = ConsumeIdentifier(this,&local_68,(ErrorMaker)ZEXT816(0x3e90c3));
    if (bVar2) {
      *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
      pAVar6 = *(Arena **)((long)pvVar4 + 8);
      if (((ulong)pAVar6 & 1) != 0) {
        pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
      }
      psVar5 = internal::ArenaStringPtr::Mutable_abi_cxx11_
                         ((ArenaStringPtr *)((long)pvVar4 + 0x18),pAVar6);
      std::__cxx11::string::_M_append((char *)psVar5,(ulong)local_68._M_dataplus._M_p);
      *(undefined1 *)((long)pvVar4 + 0x20) = 0;
      *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 2;
      LocationRecorder::~LocationRecorder(&local_48);
      if (bVar2) {
LAB_001ff0f0:
        bVar2 = true;
        goto LAB_001ff254;
      }
    }
    else {
LAB_001ff248:
      LocationRecorder::~LocationRecorder(&local_48);
    }
  }
LAB_001ff252:
  bVar2 = false;
LAB_001ff254:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseOptionNamePart(UninterpretedOption* uninterpreted_option,
                                 const LocationRecorder& part_location,
                                 const FileDescriptorProto* containing_file) {
  UninterpretedOption::NamePart* name = uninterpreted_option->add_name();
  std::string identifier;  // We parse identifiers into this string.
  if (LookingAt("(")) {    // This is an extension.
    DO(Consume("("));

    {
      LocationRecorder location(
          part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
      // An extension name consists of dot-separated identifiers, and may begin
      // with a dot.
      if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
      while (LookingAt(".")) {
        DO(Consume("."));
        name->mutable_name_part()->append(".");
        DO(ConsumeIdentifier(&identifier, "Expected identifier."));
        name->mutable_name_part()->append(identifier);
      }
    }

    DO(Consume(")"));
    name->set_is_extension(true);
  } else {  // This is a regular field.
    LocationRecorder location(
        part_location, UninterpretedOption::NamePart::kNamePartFieldNumber);
    DO(ConsumeIdentifier(&identifier, "Expected identifier."));
    name->mutable_name_part()->append(identifier);
    name->set_is_extension(false);
  }
  return true;
}